

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

void __thiscall
tcu::anon_unknown_4::Test::testRound(Test *this,double arg,double refDown,double refUp)

{
  ostream *poVar1;
  string *psVar2;
  double dVar3;
  ostringstream oss;
  Test local_1c0;
  undefined1 local_1b0 [24];
  double local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_1b0._16_8_ = refUp;
  local_198 = refDown;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"round(",6);
  poVar1 = std::ostream::_M_insert<double>(arg);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", false)",8);
  std::__cxx11::stringbuf::str();
  psVar2 = (string *)0x0;
  dVar3 = FloatFormat::round((this->m_fmt).
                             super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                             .m_data.ptr,arg);
  check(&local_1c0,psVar2,dVar3,local_198);
  if (local_1c0.m_fmt.super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.
      m_data.ptr != (FloatFormat *)local_1b0) {
    operator_delete(local_1c0.m_fmt.
                    super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data
                    .ptr,local_1b0._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"round(",6);
  poVar1 = std::ostream::_M_insert<double>(arg);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", true)",7);
  std::__cxx11::stringbuf::str();
  psVar2 = (string *)&DAT_00000001;
  dVar3 = FloatFormat::round((this->m_fmt).
                             super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                             .m_data.ptr,arg);
  check(&local_1c0,psVar2,dVar3,(double)local_1b0._16_8_);
  if (local_1c0.m_fmt.super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.
      m_data.ptr != (FloatFormat *)local_1b0) {
    operator_delete(local_1c0.m_fmt.
                    super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data
                    .ptr,local_1b0._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void Test::testRound (double arg, double refDown, double refUp) const
{
	{
		ostringstream oss;
		oss << "round(" << arg << ", false)";
		check(oss.str(), m_fmt->round(arg, false), refDown);
	}
	{
		ostringstream oss;
		oss << "round(" << arg << ", true)";
		check(oss.str(), m_fmt->round(arg, true), refUp);
	}
}